

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::check_stream
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,char *message)

{
  ulong uVar1;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *message_local;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this_local;
  
  local_18 = message;
  message_local = (char *)this;
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"failed to ",&local_59);
  std::operator+(&local_38,&local_58,local_18);
  raise_stream_error(this,(string *)&local_38);
}

Assistant:

void check_stream(const char* message)
    {
        if (stream_.fail())
        {
            raise_stream_error(std::string("failed to ") + message);
        }
    }